

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::InsertionSort<StringItem>
               (StringItem *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  StringItem *this;
  undefined1 auStack_58 [8];
  StringItem item;
  StringItem *local_38;
  
  p_Var1 = cvInfo->compareType;
  auStack_58 = (undefined1  [8])0x0;
  item.Value.ptr = (void *)0x0;
  local_38 = list + 1;
  for (uVar4 = 1; uVar4 < length; uVar4 = uVar4 + 1) {
    StringItem::operator=((StringItem *)auStack_58,list + uVar4);
    uVar5 = (int)uVar4 - 1;
    uVar6 = 0;
    uVar3 = uVar4;
    while( true ) {
      bVar2 = (*p_Var1)(cvInfo,auStack_58,list + uVar5);
      if (bVar2) {
        uVar3 = (ulong)uVar5;
      }
      else {
        uVar6 = uVar5 + 1;
        uVar5 = (uint)uVar3;
      }
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) break;
      uVar5 = (uVar5 - uVar6 >> 1) + uVar6;
    }
    uVar3 = uVar4;
    this = local_38;
    while (uVar6 < uVar3) {
      uVar3 = uVar3 - 1;
      StringItem::operator=(this,list + (uVar3 & 0xffffffff));
      this = this + -1;
    }
    StringItem::operator=(list + uVar6,(StringItem *)auStack_58);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }